

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::update_rand_timeout(raft_server *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  rep rVar4;
  element_type *peVar5;
  element_type *peVar6;
  long in_RDI;
  uniform_int_distribution<int> distribution;
  default_random_engine engine;
  uint seed;
  ptr<raft_params> params;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  uniform_int_distribution<int> *in_stack_ffffffffffffff40;
  uniform_int_distribution<int> *in_stack_ffffffffffffff48;
  context *in_stack_ffffffffffffff58;
  _Bind<std::uniform_int_distribution<int>_(std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>)>
  *__f;
  undefined4 in_stack_ffffffffffffff60;
  int32 iVar7;
  string local_80 [80];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  int local_1c;
  _Bind<std::uniform_int_distribution<int>_(std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>)>
  local_18;
  
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1d5718);
  context::get_params(in_stack_ffffffffffffff58);
  local_30.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_28.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_30);
  rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_28);
  local_1c = (int)rVar4 * *(int *)(in_RDI + 0x38);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             in_stack_ffffffffffffff40,CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
            );
  __f = &local_18;
  peVar5 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d57ab);
  iVar7 = peVar5->election_timeout_lower_bound_;
  std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1d57bc);
  std::uniform_int_distribution<int>::uniform_int_distribution
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
  std::
  bind<std::uniform_int_distribution<int>&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
            (in_stack_ffffffffffffff48,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             in_stack_ffffffffffffff40);
  std::function<int()>::operator=((function<int_()> *)CONCAT44(iVar7,in_stack_ffffffffffffff60),__f)
  ;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar2) {
    peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d582a);
    iVar3 = (*peVar6->_vptr_logger[7])();
    if (3 < iVar3) {
      peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d585a);
      peVar5 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d5871);
      uVar1 = peVar5->election_timeout_lower_bound_;
      peVar5 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d5882);
      msg_if_given_abi_cxx11_
                ((char *)local_80,"new timeout range: %d -- %d",(ulong)uVar1,
                 (ulong)(uint)peVar5->election_timeout_upper_bound_);
      (*peVar6->_vptr_logger[8])
                (peVar6,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"update_rand_timeout",0x158,local_80);
      std::__cxx11::string::~string(local_80);
    }
  }
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x1d591a);
  return;
}

Assistant:

void raft_server::update_rand_timeout() {
    ptr<raft_params> params = ctx_->get_params();
    uint seed = (uint)( std::chrono::system_clock::now()
                           .time_since_epoch().count() * id_ );
    std::default_random_engine engine(seed);
    std::uniform_int_distribution<int32>
        distribution( params->election_timeout_lower_bound_,
                      params->election_timeout_upper_bound_ );
    rand_timeout_ = std::bind(distribution, engine);
    p_in("new timeout range: %d -- %d",
         params->election_timeout_lower_bound_,
         params->election_timeout_upper_bound_);
}